

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFileSetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFileSetGenerator::cmInstallFileSetGenerator
          (cmInstallFileSetGenerator *this,string *targetName,cmFileSet *fileSet,string *dest,
          string *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,bool optional
          ,cmListFileBacktrace backtrace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  string local_88;
  cmFileSet *local_68;
  string local_60;
  cmListFileBacktrace local_40;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  pcVar3 = (dest->_M_dataplus)._M_p;
  local_68 = fileSet;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + dest->_M_string_length);
  pcVar3 = (component->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + component->_M_string_length);
  local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->Value).Name._M_dataplus._M_p;
  local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->Value).Name._M_string_length;
  ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->Value).Name._M_string_length = 0;
  ((backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->Value).Name._M_dataplus._M_p = (pointer)0x0;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_88,configurations,&local_60,message,
             exclude_from_all,false,&local_40);
  if (local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallFileSetGenerator_009bd880;
  paVar1 = &(this->TargetName).field_2;
  (this->TargetName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (targetName->_M_dataplus)._M_p;
  paVar2 = &targetName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&targetName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->TargetName).field_2 + 8) = uVar4;
  }
  else {
    (this->TargetName)._M_dataplus._M_p = pcVar3;
    (this->TargetName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->TargetName)._M_string_length = targetName->_M_string_length;
  (targetName->_M_dataplus)._M_p = (pointer)paVar2;
  targetName->_M_string_length = 0;
  (targetName->field_2)._M_local_buf[0] = '\0';
  this->FileSet = local_68;
  paVar2 = &(this->FilePermissions).field_2;
  (this->FilePermissions)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (file_permissions->_M_dataplus)._M_p;
  paVar1 = &file_permissions->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&file_permissions->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->FilePermissions).field_2 + 8) = uVar4;
  }
  else {
    (this->FilePermissions)._M_dataplus._M_p = pcVar3;
    (this->FilePermissions).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->FilePermissions)._M_string_length = file_permissions->_M_string_length;
  (file_permissions->_M_dataplus)._M_p = (pointer)paVar1;
  file_permissions->_M_string_length = 0;
  (file_permissions->field_2)._M_local_buf[0] = '\0';
  this->Optional = optional;
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  return;
}

Assistant:

cmInstallFileSetGenerator::cmInstallFileSetGenerator(
  std::string targetName, cmFileSet* fileSet, std::string const& dest,
  std::string file_permissions, std::vector<std::string> const& configurations,
  std::string const& component, MessageLevel message, bool exclude_from_all,
  bool optional, cmListFileBacktrace backtrace)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , TargetName(std::move(targetName))
  , FileSet(fileSet)
  , FilePermissions(std::move(file_permissions))
  , Optional(optional)
{
  this->ActionsPerConfig = true;
}